

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boids.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_2542f::Boid::reset(Boid *this)

{
  long *plVar1;
  long *in_RDI;
  float fVar2;
  Vec3 VVar3;
  undefined8 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined8 local_a4;
  float local_9c;
  undefined8 local_98;
  float local_90;
  undefined8 local_88;
  float local_80;
  undefined8 local_78;
  float local_70;
  undefined8 local_68;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined8 local_28;
  float local_20;
  undefined8 local_18;
  float local_10;
  
  OpenSteer::SimpleVehicle::reset
            ((SimpleVehicle *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  (**(code **)(*in_RDI + 0xf8))(0x41d80000);
  (**(code **)(*in_RDI + 0x108))(0x41100000);
  fVar2 = (float)(**(code **)(*in_RDI + 0x100))();
  (**(code **)(*in_RDI + 0xe0))(fVar2 * 0.3);
  VVar3 = OpenSteer::RandomUnitVector();
  local_20 = VVar3.z;
  local_10 = local_20;
  local_28 = VVar3._0_8_;
  local_18 = local_28;
  (**(code **)(*in_RDI + 0x88))(in_RDI,&local_18);
  OpenSteer::RandomVectorInUnitRadiusSphere();
  VVar3 = OpenSteer::Vec3::operator*
                    ((Vec3 *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     (float)((ulong)in_stack_ffffffffffffff48 >> 0x20));
  local_68 = VVar3._0_8_;
  fVar2 = VVar3.z;
  local_78 = local_68;
  local_70 = fVar2;
  local_98 = (**(code **)(*in_RDI + 0x48))(local_68);
  plVar1 = (long *)in_RDI[0x1d];
  local_90 = fVar2;
  local_88 = local_98;
  local_80 = fVar2;
  local_a4 = (**(code **)(*in_RDI + 0x40))();
  local_9c = fVar2;
  (**(code **)(*plVar1 + 0x10))(plVar1,&local_a4);
  return;
}

Assistant:

void reset (void)
        {
            // reset the vehicle
            SimpleVehicle::reset ();

            // steering force is clipped to this magnitude
            setMaxForce (27);

            // velocity is clipped to this magnitude
            setMaxSpeed (9);

            // initial slow speed
            setSpeed (maxSpeed() * 0.3f);

            // randomize initial orientation
            regenerateOrthonormalBasisUF (RandomUnitVector ());

            // randomize initial position
            setPosition (RandomVectorInUnitRadiusSphere () * 20);

            // notify proximity database that our position has changed
            proximityToken->updateForNewPosition (position());
        }